

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O3

double polymul_internal::polynomial_evaluator<double,_double,_3,_4>::eval_monomial
                 (double *p,double *x)

{
  double dVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = *x;
  dVar3 = polynomial_evaluator<double,_double,_3,_3>::eval_monomial(p,x);
  iVar2 = binomial(5,3);
  dVar4 = polynomial_evaluator<double,_double,_2,_4>::eval_monomial(p + iVar2,x + 1);
  return dVar4 + dVar3 * dVar1;
}

Assistant:

static vartype eval_monomial(const numtype p[], const vartype x[]) {
    return x[0] *
               polynomial_evaluator<numtype, vartype, Nvar, Ndeg - 1>::eval_monomial(
                   p, x) +
           polynomial_evaluator<numtype, vartype, Nvar - 1, Ndeg>::eval_monomial(
               p + binomial(Nvar + Ndeg - 2, Ndeg - 1), x + 1);
  }